

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

void compute_sgrproj_err(uint8_t *dat8,int width,int height,int dat_stride,uint8_t *src8,
                        int src_stride,int use_highbitdepth,int bit_depth,int pu_width,int pu_height
                        ,int ep,int32_t *flt0,int32_t *flt1,int flt_stride,int *exqd,int64_t *err,
                        aom_internal_error_info *error_info)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _func_void_uint8_t_ptr_int_int_int_uint8_t_ptr_int_int32_t_ptr_int_int32_t_ptr_int_int64_t_2__ptr_int64_t_ptr_sgr_params_type_ptr
  **pp_Var5;
  _func_int64_t_uint8_t_ptr_int_int_int_uint8_t_ptr_int_int32_t_ptr_int_int32_t_ptr_int_int_ptr_sgr_params_type_ptr
  **pp_Var6;
  int64_t iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int32_t *piVar12;
  sgr_params_type *params;
  int iVar13;
  int32_t *piVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  uint8_t *local_b0;
  int64_t local_a8;
  long lStack_a0;
  int64_t H [2] [2];
  int32_t *local_70;
  int32_t *local_68;
  
  if (0 < height) {
    lVar9 = (long)pu_width;
    lVar11 = (long)pu_height;
    local_68 = flt0;
    local_70 = flt1;
    lVar10 = 0;
    local_b0 = dat8;
    do {
      iVar13 = height - (int)lVar10;
      if (pu_height <= iVar13) {
        iVar13 = pu_height;
      }
      if (0 < width) {
        lVar16 = 0;
        piVar12 = local_68;
        piVar14 = local_70;
        iVar8 = width;
        do {
          iVar3 = iVar8;
          if (pu_width <= iVar8) {
            iVar3 = pu_width;
          }
          iVar3 = (*av1_selfguided_restoration)
                            (local_b0 + lVar16,iVar3,iVar13,dat_stride,piVar12,piVar14,flt_stride,ep
                             ,bit_depth,use_highbitdepth);
          if (iVar3 != 0) {
            aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                               "Error allocating buffer in av1_selfguided_restoration");
          }
          lVar16 = lVar16 + lVar9;
          piVar14 = piVar14 + lVar9;
          piVar12 = piVar12 + lVar9;
          iVar8 = iVar8 - pu_width;
        } while (lVar16 < width);
      }
      lVar10 = lVar10 + lVar11;
      local_70 = local_70 + flt_stride * lVar11;
      local_68 = local_68 + flt_stride * lVar11;
      local_b0 = local_b0 + dat_stride * lVar11;
    } while (lVar10 < (long)(ulong)(uint)height);
  }
  lVar9 = (long)ep;
  params = av1_sgr_params + lVar9;
  H[1][0] = 0;
  H[1][1] = 0;
  H[0][0] = 0;
  H[0][1] = 0;
  local_a8 = 0;
  lStack_a0 = 0;
  if (use_highbitdepth == 0) {
    if ((width & 7U) == 0) {
      pp_Var5 = &av1_calc_proj_params;
      goto LAB_0020086e;
    }
    av1_calc_proj_params_c
              (src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
               &local_a8,params);
  }
  else if ((width & 7U) == 0) {
    pp_Var5 = &av1_calc_proj_params_high_bd;
LAB_0020086e:
    (**pp_Var5)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
                &local_a8,params);
  }
  else {
    av1_calc_proj_params_high_bd_c
              (src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
               &local_a8,params);
  }
  iVar13 = params->r[0];
  if (iVar13 == 0) {
    if (H[1][1] == 0) {
      iVar8 = 0x80;
    }
    else {
      iVar8 = 0x80 - (int)((H[1][1] / (long)((ulong)(-1 < lStack_a0) * 4 + -2) + lStack_a0 * 0x80) /
                          H[1][1]);
    }
    *exqd = 0;
  }
  else {
    if (av1_sgr_params[lVar9].r[1] == 0) {
      if (H[0][0] == 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = (int)((H[0][0] / (long)((ulong)(-1 < local_a8) * 4 + -2) + local_a8 * 0x80) /
                     H[0][0]);
      }
      iVar3 = 0x1f;
      if (iVar8 < 0x1f) {
        iVar3 = iVar8;
      }
      iVar8 = -0x60;
      if (-0x60 < iVar3) {
        iVar8 = iVar3;
      }
      *exqd = iVar8;
      iVar8 = 0x5f;
      goto LAB_00200acc;
    }
    lVar10 = H[1][1] * H[0][0] - H[1][0] * H[0][1];
    if (lVar10 == 0) {
      iVar3 = 0;
      iVar8 = 0x80;
    }
    else {
      lVar11 = H[1][1] * local_a8 - H[0][1] * lStack_a0;
      bVar17 = -1 < lVar11;
      if ((uint)((ulong)(lVar11 + -0x100000000000000) >> 0x39) < 0x7f) {
        lVar16 = lVar10 + 0x7f;
        if (-1 < lVar10) {
          lVar16 = lVar10;
        }
        lVar16 = lVar16 >> 7;
      }
      else {
        lVar11 = lVar11 * 0x80;
        lVar16 = lVar10;
      }
      iVar3 = (int)((lVar16 / (long)((ulong)bVar17 * 4 + -2) + lVar11) / lVar16);
      lVar11 = lStack_a0 * H[0][0] - local_a8 * H[1][0];
      if (lVar11 + 0xff00000000000000U < 0xfe00000000000000) {
        lVar16 = lVar10 + 0x7f;
        if (-1 < lVar10) {
          lVar16 = lVar10;
        }
        lVar10 = lVar16 >> 7;
        lVar16 = lVar11;
      }
      else {
        lVar16 = lVar11 * 0x80;
      }
      iVar8 = 0x80 - (int)((lVar10 / (long)((ulong)(-1 < lVar11) * 4 + -2) + lVar16) / lVar10);
    }
    iVar4 = 0x1f;
    if (iVar3 < 0x1f) {
      iVar4 = iVar3;
    }
    iVar3 = -0x60;
    if (-0x60 < iVar4) {
      iVar3 = iVar4;
    }
    *exqd = iVar3;
    iVar8 = iVar8 - iVar3;
  }
  iVar3 = 0x5f;
  if (iVar8 < 0x5f) {
    iVar3 = iVar8;
  }
  iVar8 = -0x20;
  if (-0x20 < iVar3) {
    iVar8 = iVar3;
  }
LAB_00200acc:
  exqd[1] = iVar8;
  av1_decode_xq(exqd,(int *)H,params);
  pp_Var6 = &av1_highbd_pixel_proj_error;
  if (use_highbitdepth == 0) {
    pp_Var6 = &av1_lowbd_pixel_proj_error;
  }
  lVar10 = (**pp_Var6)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,
                       (int *)H,params);
  uVar15 = 2;
  do {
    bVar1 = 0;
    lVar11 = 0;
    bVar17 = true;
    do {
      bVar2 = bVar17;
      if (iVar13 != 0 || (int)lVar11 != 0) {
        if ((bool)(bVar1 & av1_sgr_params[lVar9].r[1] == 0)) break;
        iVar8 = (&DAT_004ff9d0)[lVar11];
        bVar17 = true;
        while (iVar8 <= (int)(exqd[lVar11] - uVar15)) {
          exqd[lVar11] = exqd[lVar11] - uVar15;
          av1_decode_xq(exqd,(int *)H,params);
          pp_Var6 = &av1_highbd_pixel_proj_error;
          if (use_highbitdepth == 0) {
            pp_Var6 = &av1_lowbd_pixel_proj_error;
          }
          iVar7 = (**pp_Var6)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,
                              flt_stride,(int *)H,params);
          if (lVar10 < iVar7) {
            exqd[lVar11] = exqd[lVar11] + uVar15;
            break;
          }
          bVar17 = false;
          lVar10 = iVar7;
          if (uVar15 != 2) goto LAB_00200d11;
        }
        if (!bVar17) break;
        iVar8 = (&DAT_004ff9d8)[lVar11];
        do {
          if (iVar8 < (int)(exqd[lVar11] + uVar15)) break;
          exqd[lVar11] = exqd[lVar11] + uVar15;
          av1_decode_xq(exqd,(int *)H,params);
          pp_Var6 = &av1_highbd_pixel_proj_error;
          if (use_highbitdepth == 0) {
            pp_Var6 = &av1_lowbd_pixel_proj_error;
          }
          iVar7 = (**pp_Var6)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,
                              flt_stride,(int *)H,params);
          if (lVar10 < iVar7) {
            exqd[lVar11] = exqd[lVar11] - uVar15;
            break;
          }
          lVar10 = iVar7;
        } while (uVar15 == 2);
      }
      lVar11 = 1;
      bVar1 = 1;
      bVar17 = false;
    } while (bVar2);
LAB_00200d11:
    bVar17 = uVar15 < 2;
    uVar15 = uVar15 >> 1;
    if (bVar17) {
      *err = lVar10;
      return;
    }
  } while( true );
}

Assistant:

static inline void compute_sgrproj_err(
    const uint8_t *dat8, const int width, const int height,
    const int dat_stride, const uint8_t *src8, const int src_stride,
    const int use_highbitdepth, const int bit_depth, const int pu_width,
    const int pu_height, const int ep, int32_t *flt0, int32_t *flt1,
    const int flt_stride, int *exqd, int64_t *err,
    struct aom_internal_error_info *error_info) {
  int exq[2];
  apply_sgr(ep, dat8, width, height, dat_stride, use_highbitdepth, bit_depth,
            pu_width, pu_height, flt0, flt1, flt_stride, error_info);
  const sgr_params_type *const params = &av1_sgr_params[ep];
  get_proj_subspace(src8, width, height, src_stride, dat8, dat_stride,
                    use_highbitdepth, flt0, flt_stride, flt1, flt_stride, exq,
                    params);
  encode_xq(exq, exqd, params);
  *err = finer_search_pixel_proj_error(
      src8, width, height, src_stride, dat8, dat_stride, use_highbitdepth, flt0,
      flt_stride, flt1, flt_stride, 2, exqd, params);
}